

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferPrecision.cpp
# Opt level: O0

GLboolean __thiscall
glcts::TextureBufferPrecision::verifyShaderCompilationStatus
          (TextureBufferPrecision *this,GLenum shader_type,char **sh_code_parts,GLuint parts_count,
          GLint expected_status)

{
  undefined1 uVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  MessageBuilder local_200;
  char *local_80;
  GLchar *info_log;
  int local_70;
  GLsizei info_log_length;
  GLint compilation_status;
  undefined8 local_60;
  char *shader_code_ptr;
  string shader_code;
  GLboolean test_passed;
  Functions *gl;
  GLint expected_status_local;
  GLuint parts_count_local;
  char **sh_code_parts_local;
  TextureBufferPrecision *pTStack_10;
  GLenum shader_type_local;
  TextureBufferPrecision *this_local;
  long lVar6;
  
  gl._0_4_ = expected_status;
  gl._4_4_ = parts_count;
  _expected_status_local = sh_code_parts;
  sh_code_parts_local._4_4_ = shader_type;
  pTStack_10 = this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  shader_code.field_2._M_local_buf[0xf] = '\x01';
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Could not create program object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                  ,0xd8);
  GVar3 = (**(code **)(lVar6 + 0x3f0))(sh_code_parts_local._4_4_);
  this->m_sh_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Could not create shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                  ,0xdb);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&shader_code_ptr,&this->super_TestCaseBase,gl._4_4_,_expected_status_local);
  local_60 = std::__cxx11::string::c_str();
  (**(code **)(lVar6 + 0x12b8))(this->m_sh_id,1,&local_60,0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Could not set shader source",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                  ,0xe0);
  (**(code **)(lVar6 + 0x248))(this->m_sh_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Failed to perform compilation of shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                  ,0xe3);
  local_70 = 0;
  (**(code **)(lVar6 + 0xa70))(this->m_sh_id,0x8b81,&local_70);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Could not retrieve shader compilation status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                  ,0xe8);
  if (local_70 != (GLint)gl) {
    shader_code.field_2._M_local_buf[0xf] = '\0';
    info_log._4_4_ = 0;
    (**(code **)(lVar6 + 0xa70))(this->m_sh_id,0x8b84,(long)&info_log + 4);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"Could not get shader info log length",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                    ,0xf0);
    if (0 < info_log._4_4_) {
      local_80 = (char *)operator_new__((long)info_log._4_4_);
      memset(local_80,0,(long)info_log._4_4_);
      (**(code **)(lVar6 + 0xa58))(this->m_sh_id,info_log._4_4_,0,local_80);
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_200,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_200,(char (*) [24])"The following shader:\n\n");
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&shader_code_ptr);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [53])
                                 "\n\n did compile with result different than expected:\n");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&gl);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (pMVar7,(char (*) [27])"\n\n Compilation info log: \n");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_80);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2b8f97b);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_200);
      if (local_80 != (char *)0x0) {
        operator_delete__(local_80);
      }
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"Could not get shader info log",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferPrecision.cpp"
                      ,0x100);
    }
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar6 + 0x448))(this->m_po_id);
    this->m_po_id = 0;
  }
  if (this->m_sh_id != 0) {
    (**(code **)(lVar6 + 0x470))(this->m_sh_id);
    this->m_sh_id = 0;
  }
  uVar1 = shader_code.field_2._M_local_buf[0xf];
  std::__cxx11::string::~string((string *)&shader_code_ptr);
  return uVar1;
}

Assistant:

glw::GLboolean TextureBufferPrecision::verifyShaderCompilationStatus(glw::GLenum	   shader_type,
																	 const char**	  sh_code_parts,
																	 const glw::GLuint parts_count,
																	 const glw::GLint  expected_status)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLboolean test_passed = true;

	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create program object");

	m_sh_id = gl.createShader(shader_type);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object");

	std::string shader_code		= specializeShader(parts_count, sh_code_parts);
	const char* shader_code_ptr = shader_code.c_str();
	gl.shaderSource(m_sh_id, 1, &shader_code_ptr, DE_NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set shader source");

	gl.compileShader(m_sh_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to perform compilation of shader object");

	/* Retrieving compilation status */
	glw::GLint compilation_status = GL_FALSE;
	gl.getShaderiv(m_sh_id, GL_COMPILE_STATUS, &compilation_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve shader compilation status");

	if (compilation_status != expected_status)
	{
		test_passed = false;

		glw::GLsizei info_log_length = 0;
		gl.getShaderiv(m_sh_id, GL_INFO_LOG_LENGTH, &info_log_length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get shader info log length");

		if (info_log_length > 0)
		{
			glw::GLchar* info_log = new glw::GLchar[info_log_length];
			memset(info_log, 0, info_log_length * sizeof(glw::GLchar));
			gl.getShaderInfoLog(m_sh_id, info_log_length, DE_NULL, info_log);

			m_testCtx.getLog() << tcu::TestLog::Message << "The following shader:\n\n"
							   << shader_code << "\n\n did compile with result different than expected:\n"
							   << expected_status << "\n\n Compilation info log: \n"
							   << info_log << "\n"
							   << tcu::TestLog::EndMessage;

			delete[] info_log;

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get shader info log");
		}
	}

	/* Clean up */
	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);
		m_po_id = 0;
	}

	if (m_sh_id != 0)
	{
		gl.deleteShader(m_sh_id);
		m_sh_id = 0;
	}

	return test_passed;
}